

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

bool __thiscall S2LatLngRect::Intersects(S2LatLngRect *this,S2LatLngRect *other)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  
  dVar1 = (this->lat_).bounds_.c_[0];
  dVar2 = (other->lat_).bounds_.c_[0];
  if (dVar1 <= dVar2) {
    if ((dVar2 <= (this->lat_).bounds_.c_[1]) && (dVar2 <= (other->lat_).bounds_.c_[1]))
    goto LAB_001f42cc;
  }
  else if ((dVar1 <= (other->lat_).bounds_.c_[1]) && (dVar1 <= (this->lat_).bounds_.c_[1])) {
LAB_001f42cc:
    bVar3 = S1Interval::Intersects(&this->lng_,&other->lng_);
    return bVar3;
  }
  return false;
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }